

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O1

bool __thiscall
HEkk::isBadBasisChange
          (HEkk *this,SimplexAlgorithm algorithm,HighsInt variable_in,HighsInt row_out,
          HighsInt rebuild_reason)

{
  uint index;
  pointer pHVar1;
  bool bVar2;
  u64 uVar3;
  ulong uVar4;
  HighsInt *pHVar5;
  uint uVar6;
  bool bVar7;
  u8 meta;
  uint64_t currhash;
  u64 maxPos;
  u64 startPos;
  u64 pos;
  u8 local_51;
  uint64_t local_50;
  u64 local_48;
  u64 local_40;
  u64 local_38;
  
  if (rebuild_reason == 0) {
    if (row_out == -1 || variable_in == -1) {
      bVar2 = false;
    }
    else {
      local_50 = (this->basis_).hash;
      index = (this->basis_).basicIndex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[row_out];
      HighsHashHelpers::sparse_inverse_combine(&local_50,index);
      uVar3 = HighsHashHelpers::modexp_M61
                        (*(ulong *)(&DAT_003d8f20 + (ulong)(variable_in & 0x3f) * 8) &
                         0x1fffffffffffffff,((ulong)(long)variable_in >> 6) + 1);
      uVar4 = (uVar3 + local_50 & 0x1fffffffffffffff) + (uVar3 + local_50 >> 0x3d);
      local_50 = uVar4 + 0xe000000000000001;
      if (uVar4 < 0x1fffffffffffffff) {
        local_50 = uVar4;
      }
      bVar2 = HighsHashTable<unsigned_long,_void>::findPosition
                        (&this->visited_basis_,&local_50,&local_51,&local_40,&local_48,&local_38);
      if ((bVar2) &&
         ((this->visited_basis_).entries._M_t.
          super___uniq_ptr_impl<HighsHashTableEntry<unsigned_long,_void>,_HighsHashTable<unsigned_long,_void>::OpNewDeleter>
          ._M_t.
          super__Tuple_impl<0UL,_HighsHashTableEntry<unsigned_long,_void>_*,_HighsHashTable<unsigned_long,_void>::OpNewDeleter>
          .super__Head_base<0UL,_HighsHashTableEntry<unsigned_long,_void>_*,_false>._M_head_impl !=
          (HighsHashTableEntry<unsigned_long,_void> *)0x0)) {
        if (this->iteration_count_ == this->previous_iteration_cycling_detected + 1) {
          if (algorithm == kDual) {
            pHVar5 = &(this->analysis_).num_dual_cycling_detections;
            *pHVar5 = *pHVar5 + 1;
          }
          else {
            pHVar5 = &(this->analysis_).num_primal_cycling_detections;
            *pHVar5 = *pHVar5 + 1;
          }
          highsLogDev(&(this->options_->super_HighsOptionsStruct).log_options,kWarning,
                      " basis change (%d out; %d in) is bad\n",(ulong)index,(ulong)(uint)variable_in
                     );
          addBadBasisChange(this,row_out,index,variable_in,kCycling,true);
          return true;
        }
        this->previous_iteration_cycling_detected = this->iteration_count_;
      }
      pHVar1 = (this->bad_basis_change_).
               super__Vector_base<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = (uint)((ulong)((long)(this->bad_basis_change_).
                                   super__Vector_base<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar1) >> 5);
      bVar2 = 0 < (int)uVar6;
      if (0 < (int)uVar6) {
        pHVar5 = &pHVar1->variable_in;
        uVar4 = 1;
        do {
          if (((pHVar5[-1] == index) && (*pHVar5 == variable_in)) && (pHVar5[-2] == row_out)) {
            ((HighsSimplexBadBasisChangeRecord *)(pHVar5 + -3))->taboo = true;
            return bVar2;
          }
          bVar2 = uVar4 < (uVar6 & 0x7fffffff);
          pHVar5 = pHVar5 + 8;
          bVar7 = uVar4 != (uVar6 & 0x7fffffff);
          uVar4 = uVar4 + 1;
        } while (bVar7);
      }
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool HEkk::isBadBasisChange(const SimplexAlgorithm algorithm,
                            const HighsInt variable_in, const HighsInt row_out,
                            const HighsInt rebuild_reason) {
  if (rebuild_reason) return false;
  if (variable_in == -1 || row_out == -1) return false;
  uint64_t currhash = basis_.hash;
  HighsInt variable_out = basis_.basicIndex_[row_out];

  HighsHashHelpers::sparse_inverse_combine(currhash, variable_out);
  HighsHashHelpers::sparse_combine(currhash, variable_in);

  bool cycling_detected = false;
  const bool posible_cycling = visited_basis_.find(currhash) != nullptr;
  if (posible_cycling) {
    if (iteration_count_ == previous_iteration_cycling_detected + 1) {
      // Cycling detected on successive iterations suggests infinite cycling
      //      highsLogDev(options_->log_options, HighsLogType::kWarning,
      //		  "Cycling detected in %s simplex:");
      // printf("Cycling detected in %s simplex solve %d (Iteration %d)",
      //        algorithm == SimplexAlgorithm::kPrimal ? "primal" : "dual",
      //        (int)debug_solve_call_num_, (int)iteration_count_);
      cycling_detected = true;
    } else {
      previous_iteration_cycling_detected = iteration_count_;
    }
  }
  if (cycling_detected) {
    if (algorithm == SimplexAlgorithm::kDual) {
      analysis_.num_dual_cycling_detections++;
    } else {
      analysis_.num_primal_cycling_detections++;
    }
    highsLogDev(options_->log_options, HighsLogType::kWarning,
                " basis change (%d out; %d in) is bad\n", (int)variable_out,
                (int)variable_in);
    addBadBasisChange(row_out, variable_out, variable_in,
                      BadBasisChangeReason::kCycling, true);
    return true;
  } else {
    // Look to see whether this basis change is in the list of bad
    // ones
    for (HighsInt iX = 0; iX < (HighsInt)bad_basis_change_.size(); iX++) {
      if (bad_basis_change_[iX].variable_out == variable_out &&
          bad_basis_change_[iX].variable_in == variable_in &&
          bad_basis_change_[iX].row_out == row_out) {
        bad_basis_change_[iX].taboo = true;
        return true;
      }
    }
  }

  return false;
}